

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

bool __thiscall ON_Linetype::SetSegment(ON_Linetype *this,int index,ON_LinetypeSegment *segment)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ON_LinetypeSegment *pOVar4;
  ON_LinetypeSegment *segment_local;
  int index_local;
  ON_Linetype *this_local;
  
  bVar2 = PatternIsLocked(this);
  if (((!bVar2) && (-1 < index)) &&
     (iVar3 = ON_SimpleArray<ON_LinetypeSegment>::Count(&this->m_private->m_segments), index < iVar3
     )) {
    pOVar4 = ON_SimpleArray<ON_LinetypeSegment>::operator[](&this->m_private->m_segments,index);
    pOVar4->m_length = segment->m_length;
    uVar1 = segment->m_reserved2;
    pOVar4->m_seg_type = segment->m_seg_type;
    pOVar4->m_reserved2 = uVar1;
    return true;
  }
  return false;
}

Assistant:

bool ON_Linetype::SetSegment( int index, const ON_LinetypeSegment& segment)
{
  if (PatternIsLocked())
    return false;

  if( index >= 0 && index < m_private->m_segments.Count())
  {
    m_private->m_segments[index] = segment;
    return true;
  }
  else
    return false;
}